

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

int Abc_TtCompare2VarCofsRev(word *pTruth,int nWords,int iVar,int Num1,int Num2)

{
  ulong *puVar1;
  ulong *puVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  word *pwVar6;
  ulong uVar7;
  long lVar8;
  word *pwVar9;
  word *pwVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  
  if (Num2 <= Num1) {
    __assert_fail("Num1 < Num2 && Num2 < 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dau/dauCanon.c"
                  ,0xed,"int Abc_TtCompare2VarCofsRev(word *, int, int, int, int)");
  }
  bVar5 = (byte)iVar;
  if (iVar < 5) {
    uVar7 = (ulong)(uint)nWords;
    do {
      if ((int)uVar7 < 1) {
        return 0;
      }
      lVar8 = uVar7 - 1;
      uVar7 = uVar7 - 1;
      uVar14 = pTruth[lVar8] >> ((byte)(Num1 << (bVar5 & 0x1f)) & 0x3f) & s_CMasks6[iVar];
      uVar11 = pTruth[lVar8] >> ((byte)(Num2 << (bVar5 & 0x1f)) & 0x3f) & s_CMasks6[iVar];
    } while (uVar14 == uVar11);
    bVar16 = uVar14 < uVar11;
  }
  else {
    if (iVar != 5) {
      if (nWords < 4) {
        __assert_fail("nWords >= 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dau/dauCanon.c"
                      ,0x113,"int Abc_TtCompare2VarCofsRev(word *, int, int, int, int)");
      }
      bVar5 = bVar5 - 6;
      iVar13 = 1 << (bVar5 & 0x1f);
      if ((uint)iVar < 7) {
        bVar5 = 0;
        iVar13 = 1;
      }
      uVar7 = (ulong)(uint)nWords;
      pwVar6 = pTruth + uVar7;
      lVar8 = (long)(iVar13 * 4);
      lVar12 = (long)iVar13;
      pwVar9 = pTruth + ((uVar7 + (long)(Num2 << (bVar5 & 0x1f)) + lVar12 + -1) - lVar8);
      pwVar10 = pTruth + ((uVar7 + (long)(Num1 << (bVar5 & 0x1f)) + lVar12 + -1) - lVar8);
      do {
        pwVar6 = pwVar6 + -lVar8;
        if (pwVar6 < pTruth) {
          return 0;
        }
        lVar15 = 0;
        while (0 < lVar12 + lVar15) {
          puVar1 = pwVar10 + lVar15;
          puVar2 = pwVar9 + lVar15;
          lVar15 = lVar15 + -1;
          if (*puVar1 != *puVar2) {
            bVar16 = *puVar1 < *puVar2;
            goto LAB_00407c7a;
          }
        }
        pwVar9 = pwVar9 + -lVar8;
        pwVar10 = pwVar10 + -lVar8;
      } while( true );
    }
    if (nWords < 2) {
      __assert_fail("nWords >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dau/dauCanon.c"
                    ,0x107,"int Abc_TtCompare2VarCofsRev(word *, int, int, int, int)");
    }
    pwVar6 = pTruth + (uint)nWords;
    do {
      pwVar6 = pwVar6 + -2;
      if (pwVar6 < pTruth) {
        return 0;
      }
      uVar3 = *(uint *)((long)pwVar6 + (ulong)(uint)Num1 * 4);
      uVar4 = *(uint *)((long)pwVar6 + (ulong)(uint)Num2 * 4);
    } while (uVar3 == uVar4);
    bVar16 = uVar3 < uVar4;
  }
LAB_00407c7a:
  return -(uint)bVar16 | 1;
}

Assistant:

static inline int Abc_TtCompare2VarCofsRev( word * pTruth, int nWords, int iVar, int Num1, int Num2 )
{
    assert( Num1 < Num2 && Num2 < 4 );
    if ( nWords == 1 )
    {
        word Cof1 = (pTruth[0] >> (Num1 * (1 << iVar))) & s_CMasks6[iVar];
        word Cof2 = (pTruth[0] >> (Num2 * (1 << iVar))) & s_CMasks6[iVar];
        if ( Cof1 != Cof2 )
            return Cof1 < Cof2 ? -1 : 1;
        return 0;
    }
    if ( iVar <= 4 )
    {
        word Cof1, Cof2;
        int w, shift = (1 << iVar);
        for ( w = nWords - 1; w >= 0; w-- )
        {
            Cof1 = (pTruth[w] >> Num1 * shift) & s_CMasks6[iVar];
            Cof2 = (pTruth[w] >> Num2 * shift) & s_CMasks6[iVar];
            if ( Cof1 != Cof2 )
                return Cof1 < Cof2 ? -1 : 1;
        }
        return 0;
    }
    if ( iVar == 5 )
    {
        unsigned * pTruthU = (unsigned *)pTruth;
        unsigned * pLimitU = (unsigned *)(pTruth + nWords);
        assert( nWords >= 2 );
        for ( pLimitU -= 4; pLimitU >= pTruthU; pLimitU -= 4 )
            if ( pLimitU[Num1] != pLimitU[Num2] )
                return pLimitU[Num1] < pLimitU[Num2] ? -1 : 1;
        return 0;
    }
    // if ( iVar > 5 )
    {
        word * pLimit = pTruth + nWords;
        int i, iStep = Abc_TtWordNum(iVar);
        int Offset1 = Num1*iStep;
        int Offset2 = Num2*iStep;
        assert( nWords >= 4 );
        for ( pLimit -= 4*iStep; pLimit >= pTruth; pLimit -= 4*iStep )
            for ( i = iStep - 1; i >= 0; i-- )
                if ( pLimit[i + Offset1] != pLimit[i + Offset2] )
                    return pLimit[i + Offset1] < pLimit[i + Offset2] ? -1 : 1;
        return 0;
    }   
}